

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O1

bool __thiscall Am_Value::operator!=(Am_Value *this,float test_value)

{
  ushort uVar1;
  double dVar2;
  float fVar3;
  
  uVar1 = this->type;
  if (uVar1 - 2 < 2) {
    fVar3 = (float)(this->value).long_value;
  }
  else {
    if (uVar1 == 0x8006) {
      dVar2 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value)
      ;
      return (bool)(-((double)test_value != dVar2) & 1);
    }
    if (uVar1 != 5) {
      return true;
    }
    fVar3 = (this->value).float_value;
  }
  return (bool)(-(test_value != fVar3) & 1);
}

Assistant:

bool
Am_Value::operator!=(float test_value) const
{
  switch (type) {
  case Am_FLOAT:
    return value.float_value != test_value;
  case Am_DOUBLE:
    return (double)*(Am_Double_Data *)value.wrapper_value != test_value;
  case Am_INT:
  case Am_LONG:
    return value.long_value != test_value;
  default:
    return true;
  }
}